

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O2

int64 __thiscall Time::toTimestamp(Time *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  tm local_38;
  
  local_38.tm_sec = this->sec;
  local_38.tm_min = this->min;
  local_38.tm_hour = this->hour;
  local_38.tm_mday = this->day;
  uVar1 = this->month;
  uVar2 = this->year;
  local_38.tm_mon = uVar1 + -1;
  local_38.tm_year = uVar2 + -0x76c;
  local_38.tm_wday = this->wday;
  local_38.tm_yday = this->yday;
  local_38.tm_isdst = (int)this->dst;
  if (this->utc == true) {
    lVar3 = timegm(&local_38);
  }
  else {
    lVar3 = mktime(&local_38);
  }
  return lVar3 * 1000;
}

Assistant:

int64 Time::toTimestamp()
{
  tm tm;
  tm.tm_sec = sec;
  tm.tm_min = min;
  tm.tm_hour = hour;
  tm.tm_mday = day;
  tm.tm_mon = month - 1;
  tm.tm_year = year - 1900;
  tm.tm_wday = wday;
  tm.tm_yday = yday;
  tm.tm_isdst = dst;
  if(utc)
#ifdef _MSC_VER
    return _mkgmtime(&tm) * 1000LL;
#else
    return timegm(&tm) * 1000LL;
#endif
  else
    return mktime(&tm) * 1000LL;
}